

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scantoken.cpp
# Opt level: O1

void __thiscall YAML::Scanner::ScanPlainScalar(Scanner *this)

{
  _Elt_pointer pcVar1;
  int iVar2;
  ScanScalarParams *params_00;
  ScanScalarParams params;
  string scalar;
  undefined1 local_d0 [40];
  undefined1 local_a8;
  char *local_a0;
  _Elt_pointer local_98;
  char local_90 [16];
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  size_t local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined1 local_48 [32];
  
  local_98 = (_Elt_pointer)0x0;
  local_90[0] = '\0';
  local_d0._0_8_ = (istream *)0x0;
  local_d0[8] = 0;
  local_d0._20_4_ = utf8;
  local_d0[0x18] = 0;
  local_d0._12_4_ = 0;
  local_d0[0x10] = 0;
  local_d0[0x11] = 0;
  local_d0[0x12] = 0;
  local_d0._28_5_ = 0;
  local_d0._33_3_ = 0;
  local_d0._36_4_ = 0;
  local_a8 = 0;
  local_a0 = local_90;
  if ((this->m_flows).c.
      super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_cur ==
      (this->m_flows).c.
      super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_d0._0_8_ = Exp::ScanScalarEnd();
  }
  else {
    local_d0._0_8_ = Exp::ScanScalarEndInFlow();
  }
  local_d0[8] = 0;
  iVar2 = 0;
  if ((this->m_flows).c.
      super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_cur ==
      (this->m_flows).c.
      super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur) {
    iVar2 = GetTopIndent(this);
    iVar2 = iVar2 + 1;
  }
  local_d0._20_4_ = utf16be;
  local_d0[0x11] = 1;
  local_d0[0x18] = 1;
  params_00 = (ScanScalarParams *)0x1ffffffff;
  local_d0._28_5_ = 0x1ffffffff;
  local_d0._33_3_ = 0;
  local_d0._36_4_ = 2;
  local_d0._12_4_ = iVar2;
  InsertPotentialSimpleKey(this);
  pcVar1 = *(_Elt_pointer *)&(this->INPUT).m_mark;
  iVar2 = (this->INPUT).m_mark.column;
  ScanScalar_abi_cxx11_((string *)local_80,(YAML *)this,(Stream *)local_d0,params_00);
  std::__cxx11::string::operator=((string *)&local_a0,(string *)local_80);
  if ((undefined1 *)local_80._0_8_ != local_70) {
    operator_delete((void *)local_80._0_8_);
  }
  this->m_simpleKeyAllowed = (bool)local_a8;
  this->m_canBeJSONFlow = false;
  local_80._0_8_ = (pointer)0x1300000000;
  local_60 = 0;
  local_58._M_local_buf[0] = '\0';
  local_48._0_8_ = (pointer)0x0;
  local_48._8_4_ = 0;
  local_48._12_4_ = 0;
  local_48._16_4_ = 0;
  local_48._20_8_ = 0;
  local_80._8_8_ = pcVar1;
  local_70._0_4_ = iVar2;
  local_70._8_8_ = &local_58;
  std::__cxx11::string::_M_assign((string *)(local_70 + 8));
  std::deque<YAML::Token,_std::allocator<YAML::Token>_>::push_back
            (&(this->m_tokens).c,(value_type *)local_80);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._8_8_ != &local_58) {
    operator_delete((void *)local_70._8_8_);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  return;
}

Assistant:

void Scanner::ScanPlainScalar() {
  std::string scalar;

  // set up the scanning parameters
  ScanScalarParams params;
  params.end =
      (InFlowContext() ? &Exp::ScanScalarEndInFlow() : &Exp::ScanScalarEnd());
  params.eatEnd = false;
  params.indent = (InFlowContext() ? 0 : GetTopIndent() + 1);
  params.fold = FOLD_FLOW;
  params.eatLeadingWhitespace = true;
  params.trimTrailingSpaces = true;
  params.chomp = STRIP;
  params.onDocIndicator = BREAK;
  params.onTabInIndentation = THROW;

  // insert a potential simple key
  InsertPotentialSimpleKey();

  Mark mark = INPUT.mark();
  scalar = ScanScalar(INPUT, params);

  // can have a simple key only if we ended the scalar by starting a new line
  m_simpleKeyAllowed = params.leadingSpaces;
  m_canBeJSONFlow = false;

  // finally, check and see if we ended on an illegal character
  // if(Exp::IllegalCharInScalar.Matches(INPUT))
  //	throw ParserException(INPUT.mark(), ErrorMsg::CHAR_IN_SCALAR);

  Token token(Token::PLAIN_SCALAR, mark);
  token.value = scalar;
  m_tokens.push(token);
}